

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp *p_cp)

{
  OPJ_UINT32 a;
  OPJ_UINT32 a_00;
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  opj_image_comp_t *local_50;
  opj_image_comp_t *l_img_comp;
  OPJ_UINT32 l_comp_y1;
  OPJ_UINT32 l_comp_x1;
  OPJ_UINT32 l_comp_y0;
  OPJ_UINT32 l_comp_x0;
  OPJ_UINT32 l_y1;
  OPJ_UINT32 l_x1;
  OPJ_UINT32 l_y0;
  OPJ_UINT32 l_x0;
  OPJ_UINT32 l_height;
  OPJ_UINT32 l_width;
  OPJ_UINT32 i;
  opj_cp *p_cp_local;
  opj_image_t *p_image_header_local;
  
  a = opj_uint_max(p_cp->tx0,p_image_header->x0);
  a_00 = opj_uint_max(p_cp->ty0,p_image_header->y0);
  OVar2 = p_cp->ty0;
  OVar3 = p_cp->th;
  OVar4 = p_cp->tdy;
  OVar1 = opj_uint_adds(p_cp->tx0 + (p_cp->tw - 1) * p_cp->tdx,p_cp->tdx);
  OVar1 = opj_uint_min(OVar1,p_image_header->x1);
  OVar2 = opj_uint_adds(OVar2 + (OVar3 - 1) * OVar4,p_cp->tdy);
  OVar2 = opj_uint_min(OVar2,p_image_header->y1);
  local_50 = p_image_header->comps;
  for (l_height = 0; l_height < p_image_header->numcomps; l_height = l_height + 1) {
    OVar3 = opj_uint_ceildiv(a,local_50->dx);
    OVar4 = opj_uint_ceildiv(a_00,local_50->dy);
    OVar5 = opj_uint_ceildiv(OVar1,local_50->dx);
    OVar6 = opj_uint_ceildiv(OVar2,local_50->dy);
    OVar5 = opj_uint_ceildivpow2(OVar5 - OVar3,local_50->factor);
    OVar6 = opj_uint_ceildivpow2(OVar6 - OVar4,local_50->factor);
    local_50->w = OVar5;
    local_50->h = OVar6;
    local_50->x0 = OVar3;
    local_50->y0 = OVar4;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header,
                                  const struct opj_cp * p_cp)
{
    OPJ_UINT32 i, l_width, l_height;
    OPJ_UINT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_UINT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_x0 = opj_uint_max(p_cp->tx0, p_image_header->x0);
    l_y0 = opj_uint_max(p_cp->ty0, p_image_header->y0);
    l_x1 = p_cp->tx0 + (p_cp->tw - 1U) *
           p_cp->tdx; /* validity of p_cp members used here checked in opj_j2k_read_siz. Can't overflow. */
    l_y1 = p_cp->ty0 + (p_cp->th - 1U) * p_cp->tdy; /* can't overflow */
    l_x1 = opj_uint_min(opj_uint_adds(l_x1, p_cp->tdx),
                        p_image_header->x1); /* use add saturated to prevent overflow */
    l_y1 = opj_uint_min(opj_uint_adds(l_y1, p_cp->tdy),
                        p_image_header->y1); /* use add saturated to prevent overflow */

    l_img_comp = p_image_header->comps;
    for (i = 0; i < p_image_header->numcomps; ++i) {
        l_comp_x0 = opj_uint_ceildiv(l_x0, l_img_comp->dx);
        l_comp_y0 = opj_uint_ceildiv(l_y0, l_img_comp->dy);
        l_comp_x1 = opj_uint_ceildiv(l_x1, l_img_comp->dx);
        l_comp_y1 = opj_uint_ceildiv(l_y1, l_img_comp->dy);
        l_width   = opj_uint_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
        l_height  = opj_uint_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
        l_img_comp->w = l_width;
        l_img_comp->h = l_height;
        l_img_comp->x0 = l_comp_x0;
        l_img_comp->y0 = l_comp_y0;
        ++l_img_comp;
    }
}